

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_upload(Curl_easy *data)

{
  FILEPROTO *pFVar1;
  char *pcVar2;
  int __fd;
  int iVar3;
  char *pcVar4;
  curltime cVar5;
  curltime now;
  size_t local_f8;
  size_t readcount;
  size_t nwrite;
  size_t nread;
  char *buf2;
  stat file_stat;
  curl_off_t bytecount;
  char *buf;
  int local_30;
  CURLcode result;
  int mode;
  int fd;
  char *dir;
  FILEPROTO *file;
  Curl_easy *data_local;
  
  pFVar1 = (data->req).p.file;
  pcVar4 = strchr(pFVar1->path,0x2f);
  buf._4_4_ = CURLE_OK;
  pcVar2 = (data->state).buffer;
  file_stat.__glibc_reserved[2] = 0;
  (data->req).upload_fromhere = pcVar2;
  if (pcVar4 == (char *)0x0) {
    data_local._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
  }
  else if (pcVar4[1] == '\0') {
    data_local._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
  }
  else {
    if ((data->state).resume_from == 0) {
      local_30 = 0x241;
    }
    else {
      local_30 = 0x441;
    }
    __fd = open64(pFVar1->path,local_30,(ulong)(data->set).new_file_perms);
    if (__fd < 0) {
      Curl_failf(data,"Can\'t open %s for writing",pFVar1->path);
      data_local._4_4_ = CURLE_WRITE_ERROR;
    }
    else {
      if ((data->state).infilesize != -1) {
        Curl_pgrsSetUploadSize(data,(data->state).infilesize);
      }
      if ((data->state).resume_from < 0) {
        iVar3 = fstat64(__fd,(stat64 *)&buf2);
        if (iVar3 != 0) {
          close(__fd);
          Curl_failf(data,"Can\'t get the size of %s",pFVar1->path);
          return CURLE_WRITE_ERROR;
        }
        (data->state).resume_from = file_stat.st_rdev;
      }
      while( true ) {
        if (((buf._4_4_ != CURLE_OK) ||
            (buf._4_4_ = Curl_fillreadbuffer(data,(ulong)(data->set).buffer_size,&local_f8),
            buf._4_4_ != CURLE_OK)) || (local_f8 == 0)) goto LAB_00a21523;
        nwrite = local_f8;
        nread = (size_t)pcVar2;
        if ((data->state).resume_from != 0) {
          if ((data->state).resume_from < (long)local_f8) {
            nread = (size_t)(pcVar2 + (data->state).resume_from);
            nwrite = local_f8 - (data->state).resume_from;
            (data->state).resume_from = 0;
          }
          else {
            (data->state).resume_from = (data->state).resume_from - local_f8;
            nwrite = 0;
          }
        }
        readcount = write(__fd,(void *)nread,nwrite);
        if (readcount != nwrite) break;
        file_stat.__glibc_reserved[2] = nwrite + file_stat.__glibc_reserved[2];
        Curl_pgrsSetUploadCounter(data,file_stat.__glibc_reserved[2]);
        iVar3 = Curl_pgrsUpdate(data);
        if (iVar3 == 0) {
          cVar5 = Curl_now();
          now._12_4_ = 0;
          now.tv_sec = SUB128(cVar5._0_12_,0);
          now.tv_usec = SUB124(cVar5._0_12_,8);
          buf._4_4_ = Curl_speedcheck(data,now);
        }
        else {
          buf._4_4_ = CURLE_ABORTED_BY_CALLBACK;
        }
      }
      buf._4_4_ = CURLE_SEND_ERROR;
LAB_00a21523:
      if ((buf._4_4_ == CURLE_OK) && (iVar3 = Curl_pgrsUpdate(data), iVar3 != 0)) {
        buf._4_4_ = CURLE_ABORTED_BY_CALLBACK;
      }
      close(__fd);
      data_local._4_4_ = buf._4_4_;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode file_upload(struct Curl_easy *data)
{
  struct FILEPROTO *file = data->req.p.file;
  const char *dir = strchr(file->path, DIRSEP);
  int fd;
  int mode;
  CURLcode result = CURLE_OK;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  struct_stat file_stat;
  const char *buf2;

  /*
   * Since FILE: doesn't do the full init, we need to provide some extra
   * assignments here.
   */
  data->req.upload_fromhere = buf;

  if(!dir)
    return CURLE_FILE_COULDNT_READ_FILE; /* fix: better error code */

  if(!dir[1])
    return CURLE_FILE_COULDNT_READ_FILE; /* fix: better error code */

#ifdef O_BINARY
#define MODE_DEFAULT O_WRONLY|O_CREAT|O_BINARY
#else
#define MODE_DEFAULT O_WRONLY|O_CREAT
#endif

  if(data->state.resume_from)
    mode = MODE_DEFAULT|O_APPEND;
  else
    mode = MODE_DEFAULT|O_TRUNC;

  fd = open(file->path, mode, data->set.new_file_perms);
  if(fd < 0) {
    failf(data, "Can't open %s for writing", file->path);
    return CURLE_WRITE_ERROR;
  }

  if(-1 != data->state.infilesize)
    /* known size of data to "upload" */
    Curl_pgrsSetUploadSize(data, data->state.infilesize);

  /* treat the negative resume offset value as the case of "-" */
  if(data->state.resume_from < 0) {
    if(fstat(fd, &file_stat)) {
      close(fd);
      failf(data, "Can't get the size of %s", file->path);
      return CURLE_WRITE_ERROR;
    }
    data->state.resume_from = (curl_off_t)file_stat.st_size;
  }

  while(!result) {
    size_t nread;
    size_t nwrite;
    size_t readcount;
    result = Curl_fillreadbuffer(data, data->set.buffer_size, &readcount);
    if(result)
      break;

    if(!readcount)
      break;

    nread = readcount;

    /*skip bytes before resume point*/
    if(data->state.resume_from) {
      if((curl_off_t)nread <= data->state.resume_from) {
        data->state.resume_from -= nread;
        nread = 0;
        buf2 = buf;
      }
      else {
        buf2 = buf + data->state.resume_from;
        nread -= (size_t)data->state.resume_from;
        data->state.resume_from = 0;
      }
    }
    else
      buf2 = buf;

    /* write the data to the target */
    nwrite = write(fd, buf2, nread);
    if(nwrite != nread) {
      result = CURLE_SEND_ERROR;
      break;
    }

    bytecount += nread;

    Curl_pgrsSetUploadCounter(data, bytecount);

    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(!result && Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;

  close(fd);

  return result;
}